

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

int __thiscall DataVector::copy(DataVector *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  size_type local_28;
  EVP_PKEY_CTX *local_20;
  vector<bool,_std::allocator<bool>_> *mask_local;
  DataVector *src_local;
  DataVector *this_local;
  
  local_20 = src;
  mask_local = (vector<bool,_std::allocator<bool>_> *)dst;
  src_local = this;
  local_28 = std::vector<DataPoint,_std::allocator<DataPoint>_>::size
                       ((vector<DataPoint,_std::allocator<DataPoint>_> *)dst);
  std::vector<DataPoint,_std::allocator<DataPoint>_>::size
            (&this->super_vector<DataPoint,_std::allocator<DataPoint>_>);
  std::vector<bool,_std::allocator<bool>_>::size((vector<bool,_std::allocator<bool>_> *)local_20);
  iVar1 = copy(dst,(EVP_PKEY_CTX *)&local_28);
  return iVar1;
}

Assistant:

void
    copy(DataVector const & src, std::vector<bool> const & mask)
    {
        DataVector::copy(src, src.size(), *this, this->size(), mask, mask.size());
    }